

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

Value __thiscall
Fossilize::uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (Fossilize *this,uint64_t value,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  undefined8 extraout_RDX;
  Value VVar1;
  char local_38 [8];
  char str [17];
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  uint64_t value_local;
  
  unique0x1000004a = alloc;
  sprintf(local_38,"%016lx",value);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,local_38,stack0xffffffffffffffe0);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

static Value uint64_string(uint64_t value, Allocator &alloc)
{
	char str[17]; // 16 digits + null
	sprintf(str, "%016" PRIx64, value);
	return Value(str, alloc);
}